

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDebugReportUtil.hpp
# Opt level: O2

void __thiscall
vk::DebugReportMessage::DebugReportMessage
          (DebugReportMessage *this,VkDebugReportFlagsEXT flags_,
          VkDebugReportObjectTypeEXT objectType_,deUint64 object_,size_t location_,
          deInt32 messageCode_,string *layerPrefix_,string *message_)

{
  this->flags = flags_;
  this->objectType = objectType_;
  this->object = object_;
  this->location = location_;
  this->messageCode = messageCode_;
  std::__cxx11::string::string((string *)&this->layerPrefix,(string *)layerPrefix_);
  std::__cxx11::string::string((string *)&this->message,(string *)message_);
  return;
}

Assistant:

DebugReportMessage (VkDebugReportFlagsEXT		flags_,
						VkDebugReportObjectTypeEXT	objectType_,
						deUint64					object_,
						size_t						location_,
						deInt32						messageCode_,
						const std::string&			layerPrefix_,
						const std::string&			message_)
		: flags			(flags_)
		, objectType	(objectType_)
		, object		(object_)
		, location		(location_)
		, messageCode	(messageCode_)
		, layerPrefix	(layerPrefix_)
		, message		(message_)
	{}